

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tools.cpp
# Opt level: O2

size_t JsonTools::size_of_item(string *s,size_t current,char start,char end)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 1;
  for (sVar2 = 1; (lVar4 != lVar3 && (current + sVar2 <= s->_M_string_length)); sVar2 = sVar2 + 1) {
    cVar1 = (s->_M_dataplus)._M_p[sVar2 + current];
    lVar4 = lVar4 + (ulong)(cVar1 == start);
    lVar3 = lVar3 + (ulong)(cVar1 == end);
  }
  return sVar2;
}

Assistant:

size_t JsonTools::size_of_item(const string& s, const size_t current, const char start, const char end){
	size_t st = 1, en = 0, i = current + 1;
	while (st != en && i <= s.size()){
		if (s[i] == start) ++st;
		if (s[i] == end) ++en;
		++i;
	}
	return i - current;
}